

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdEmuD3D56TexFormat::emulate_mthd(MthdEmuD3D56TexFormat *this)

{
  pgraph_state *state;
  byte *pbVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int i;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint32_t *puVar17;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  uVar5 = (this->super_SingleMthdTest).super_MthdTest.val;
  uVar9 = uVar5 >> 0xc & 0xf;
  uVar6 = uVar5 >> 8 & 0xf;
  uVar11 = uVar5 >> 0x10 & 0xf;
  uVar13 = uVar5 >> 0x14 & 0xf;
  uVar15 = uVar5 >> 0x18 & 7;
  uVar14 = uVar5 >> 0x1c & 7;
  uVar7 = (uVar5 & 0xf0fff002) + 0x2000000;
  if (uVar15 != 2) {
    uVar7 = uVar5;
  }
  uVar7 = uVar7 & 0xf7fff002;
  if (uVar15 == 1) {
    uVar7 = uVar5 & 0xfffff002;
  }
  iVar12 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
           chipset.chipset;
  uVar4 = (uint)(iVar12 < 0x11);
  uVar16 = (uVar5 & 0xf0fff002) + 0x2000000 + uVar4 * 0x1000000;
  if (uVar15 != 0) {
    uVar16 = uVar7;
  }
  uVar7 = (uVar16 & 0xf8fff002) + 0x3000000;
  if (uVar15 != 4) {
    uVar7 = uVar16;
  }
  uVar10 = (uint)(0x10 < iVar12);
  uVar16 = uVar10 << 0x18 | uVar16 & 0xf8fff002;
  if (uVar15 != 5) {
    uVar16 = uVar7;
  }
  uVar7 = uVar16 & 0xf8fff002;
  if (uVar15 < 6) {
    uVar7 = uVar16;
  }
  uVar15 = uVar7 & 0x7ffff002;
  if (uVar14 == 1) {
    uVar15 = uVar7;
  }
  uVar7 = uVar4 << 0x1d | uVar7 & 0xffff002;
  if (uVar14 != 0) {
    uVar7 = uVar15;
  }
  uVar15 = uVar7 & 0x8fffffff;
  if (uVar14 == 7) {
    uVar7 = uVar15;
  }
  uVar4 = uVar15 + 0x30000000;
  if (uVar14 != 4) {
    uVar4 = uVar7;
  }
  uVar7 = uVar15 + 0x10000000;
  if (uVar14 != 5) {
    uVar7 = uVar4;
  }
  uVar15 = uVar10 << 0x1d | uVar15;
  if (uVar14 != 6) {
    uVar15 = uVar7;
  }
  uVar7 = uVar13;
  if (uVar13 < uVar11) {
    uVar7 = uVar11;
  }
  uVar7 = uVar7 + 1;
  if (uVar9 <= uVar13) {
    uVar7 = uVar9;
  }
  if (uVar9 <= uVar11) {
    uVar7 = uVar9;
  }
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.cls;
  if (uVar2 == 0x54) {
    if (uVar6 != 1) goto LAB_001ea657;
  }
  else if (uVar6 != 1 || uVar2 != 0x94) goto LAB_001ea657;
  uVar6 = 0;
LAB_001ea657:
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      if (((uint)this->which >> ((uint)lVar8 & 0x1f) & 1) != 0) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[lVar8] =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format
             [lVar8] & 8 | (uVar7 << 0xc | uVar6 << 7) + (uVar5 >> 1 & 0x50 | uVar15 & 0xffff002f);
      }
    }
    uVar2 = (this->super_SingleMthdTest).super_MthdTest.cls;
    uVar6 = ~uVar15;
    if ((uVar2 == 0x54) || (uVar2 == 0x94)) {
      uVar5 = (this->super_SingleMthdTest).super_MthdTest.val >> 2 & 3;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_control_a[0] =
           uVar5 + 0x4003ffc0;
      puVar17 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_control_a
                + 1;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_control_a[1] =
           uVar5 | 0x3ffc0;
      uVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[0];
      uVar7 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b & 0x40
      ;
      uVar5 = uVar6 >> 0x1d & 0xfffffffc;
      if ((uVar15 >> 0x1b & 1) != 0) {
        uVar5 = 0;
      }
      if (uVar7 == 0) {
        uVar5 = uVar7 >> 6;
      }
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b =
           uVar5 | (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b
                   & 0xfffefffb;
      pgraph_celsius_icmd(state,4,uVar2,false);
      pgraph_celsius_icmd(state,6,(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                                  bundle_tex_control_a[0],false);
      iVar12 = 7;
    }
    else {
      iVar3 = this->which;
      if ((long)iVar3 == 2) {
        uVar7 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b &
                0x40;
        uVar5 = 0;
        if ((uVar15 >> 0x1b & 1) == 0) {
          uVar5 = uVar6 >> 0xf & 0x10000;
        }
        if (uVar7 == 0) {
          uVar5 = uVar7 >> 6;
        }
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b =
             uVar5 | (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                     celsius_xf_misc_b & 0xfffeffff;
      }
      iVar12 = iVar3 + 3;
      puVar17 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_filter +
                (long)iVar3 + 0xf;
    }
    pgraph_celsius_icmd(state,iVar12,*puVar17,true);
    uVar5 = this->which;
    uVar9 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b;
    uVar7 = uVar5 & 1;
    if (uVar7 != 0) {
      uVar13 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b &
               0x40;
      uVar11 = 0;
      if ((uVar15 >> 0x1b & 1) == 0) {
        uVar11 = uVar6 >> 0x1d & 0xfffffffc;
      }
      if (uVar13 == 0) {
        uVar11 = uVar13 >> 6;
      }
      uVar9 = uVar9 & 0xfffffffb | uVar11;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b = uVar9;
    }
    uVar6 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a |
            0x10000000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a = uVar6;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[2] = uVar6;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[3] = uVar9;
  }
  else {
    uVar5 = this->which;
    uVar7 = uVar5 & 1;
  }
  if (uVar7 != 0) {
    pbVar1 = (byte *)((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid +
                     5);
    *pbVar1 = *pbVar1 | 0x80;
  }
  if ((uVar5 & 2) != 0) {
    pbVar1 = (byte *)((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid +
                     6);
    *pbVar1 = *pbVar1 | 0x20;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t rval = val & 0xfffff002;
		int omips = extr(val, 12, 4);
		int sfmt = extr(val, 8, 4);
		int fmt = sfmt;
		int mips = omips;
		int su = extr(val, 16, 4);
		int sv = extr(val, 20, 4);
		int wrapu = extr(val, 24, 3);
		int wrapv = extr(val, 28, 3);
		if (wrapu == 2)
			insrt(rval, 24, 4, 2);
		if (wrapu != 1)
			insrt(rval, 27, 1, 0);
		if (wrapu == 0)
			insrt(rval, 24, 3, nv04_pgraph_is_nv15p(&chipset) ? 2 : 3);
		if (wrapu == 4)
			insrt(rval, 24, 3, 3);
		if (wrapu == 5)
			insrt(rval, 24, 3, nv04_pgraph_is_nv15p(&chipset) ? 1 : 0);
		if (wrapu > 5)
			insrt(rval, 24, 3, 0);
		if (wrapv != 1)
			insrt(rval, 31, 1, 0);
		if (wrapv == 0)
			insrt(rval, 28, 3, nv04_pgraph_is_nv15p(&chipset) ? 0 : 2);
		if (wrapv == 7)
			insrt(rval, 28, 3, 0);
		if (wrapv == 4)
			insrt(rval, 28, 3, 3);
		if (wrapv == 5)
			insrt(rval, 28, 3, 1);
		if (wrapv == 6)
			insrt(rval, 28, 3, nv04_pgraph_is_nv15p(&chipset) ? 2 : 0);
		if (mips > su && mips > sv)
			mips = (su > sv ? su : sv) + 1;
		if (cls == 0x54 || cls == 0x94) {
			if (sfmt == 1)
				fmt = 0;
		}
		insrt(rval, 4, 1, extr(val, 5, 1));
		insrt(rval, 6, 1, extr(val, 7, 1));
		insrt(rval, 7, 5, fmt);
		insrt(rval, 12, 4, mips);
		if (!extr(exp.nsource, 1, 1)) {
			for (int i = 0; i < 2; i++) {
				if (which & 1 << i) {
					exp.bundle_tex_format[i] = rval | (exp.bundle_tex_format[i] & 8);
				}
			}
			if (cls == 0x94 || cls == 0x54) {
				exp.bundle_tex_control_a[0] = 0x4003ffc0 | extr(val, 2, 2);
				exp.bundle_tex_control_a[1] = 0x3ffc0 | extr(val, 2, 2);
				insrt(exp.celsius_xf_misc_b, 2, 1,
					extr(exp.bundle_config_b, 6, 1) &&
					!extr(rval, 27, 1) && !extr(rval, 31, 1));
				insrt(exp.celsius_xf_misc_b, 16, 1, 0);
				pgraph_celsius_icmd(&exp, 4, exp.bundle_tex_format[0], false);
				pgraph_celsius_icmd(&exp, 6, exp.bundle_tex_control_a[0], false);
				pgraph_celsius_icmd(&exp, 7, exp.bundle_tex_control_a[1], true);
			} else {
				if (which == 2) {
					insrt(exp.celsius_xf_misc_b, 16, 1,
						extr(exp.bundle_config_b, 6, 1) &&
						!extr(rval, 27, 1) && !extr(rval, 31, 1));
				}
				pgraph_celsius_icmd(&exp, 4 + which - 1, exp.bundle_tex_format[which - 1], true);
			}
			if (which & 1) {
				insrt(exp.celsius_xf_misc_b, 2, 1,
					extr(exp.bundle_config_b, 6, 1) &&
					!extr(rval, 27, 1) && !extr(rval, 31, 1));
			}
			insrt(exp.celsius_xf_misc_a, 28, 1, 1);
			exp.celsius_pipe_junk[2] = exp.celsius_xf_misc_a;
			exp.celsius_pipe_junk[3] = exp.celsius_xf_misc_b;
		}
		if (which & 1)
			insrt(exp.valid[1], 15, 1, 1);
		if (which & 2)
			insrt(exp.valid[1], 21, 1, 1);
	}